

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapHeapArgumentsInfo *pSVar1;
  uint local_24;
  uint32 i;
  SnapHeapArgumentsInfo *argsInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
                     (snpObject);
  FileWriter::WriteUInt32(writer,numberOfArgs,pSVar1->NumOfArguments,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(pSVar1->IsFrameNullPtr & 1),1);
  FileWriter::WriteAddr(writer,objectId,pSVar1->FrameObject,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->FormalCount,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x48,1);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (local_24 = 0; local_24 < pSVar1->FormalCount; local_24 = local_24 + 1) {
    (*writer->_vptr_FileWriter[0xb])
              (writer,(ulong)pSVar1->DeletedArgFlags[local_24],(ulong)(local_24 != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void EmitAddtlInfo_SnapHeapArgumentsInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, argsKind>(snpObject);

            writer->WriteUInt32(NSTokens::Key::numberOfArgs, argsInfo->NumOfArguments, NSTokens::Separator::CommaAndBigSpaceSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, argsInfo->IsFrameNullPtr, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::objectId, argsInfo->FrameObject, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(argsInfo->FormalCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::deletedArgs, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < argsInfo->FormalCount; ++i)
            {
                writer->WriteNakedByte(argsInfo->DeletedArgFlags[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }